

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeVertexArrayApiTests.cpp
# Opt level: O0

void deqp::gles31::Functional::NegativeTestShared::vertex_attribi4v(NegativeTestContext *ctx)

{
  GLuint index;
  allocator<char> local_59;
  string local_58;
  GLuint aGStack_38 [2];
  GLuint valUint [4];
  GLint valInt [4];
  int maxVertexAttribs;
  NegativeTestContext *ctx_local;
  
  index = NegativeTestContext::getInteger(ctx,0x8869);
  valUint[2] = 0;
  valUint[3] = 0;
  aGStack_38[0] = 0;
  aGStack_38[1] = 0;
  valUint[0] = 0;
  valUint[1] = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,
             "GL_INVALID_VALUE is generated if index is greater than or equal to GL_MAX_VERTEX_ATTRIBS."
             ,&local_59);
  NegativeTestContext::beginSection(ctx,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator(&local_59);
  glu::CallLogWrapper::glVertexAttribI4iv(&ctx->super_CallLogWrapper,index,(GLint *)(valUint + 2));
  NegativeTestContext::expectError(ctx,0x501);
  glu::CallLogWrapper::glVertexAttribI4uiv(&ctx->super_CallLogWrapper,index,aGStack_38);
  NegativeTestContext::expectError(ctx,0x501);
  NegativeTestContext::endSection(ctx);
  return;
}

Assistant:

void vertex_attribi4v (NegativeTestContext& ctx)
{
	int maxVertexAttribs	= ctx.getInteger(GL_MAX_VERTEX_ATTRIBS);
	GLint valInt[4]			= { 0 };
	GLuint valUint[4]		= { 0 };

	ctx.beginSection("GL_INVALID_VALUE is generated if index is greater than or equal to GL_MAX_VERTEX_ATTRIBS.");
	ctx.glVertexAttribI4iv(maxVertexAttribs, &valInt[0]);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glVertexAttribI4uiv(maxVertexAttribs, &valUint[0]);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();
}